

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O2

_Bool bson_append_maxkey(bson_t *bson,char *key,int key_length)

{
  _Bool _Var1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (bson == (bson_t *)0x0) {
    pcVar4 = "bson";
    uVar3 = 0x598;
  }
  else {
    if (key != (char *)0x0) {
      sVar2 = (size_t)(uint)key_length;
      if (key_length < 0) {
        sVar2 = strlen(key);
      }
      _Var1 = _bson_append(bson,3,(int)sVar2 + 2,1,&bson_append_maxkey::type,sVar2,key,1,"");
      return _Var1;
    }
    pcVar4 = "key";
    uVar3 = 0x599;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
          uVar3,"bson_append_maxkey",pcVar4);
  abort();
}

Assistant:

bool
bson_append_maxkey (bson_t *bson, const char *key, int key_length)
{
   static const uint8_t type = BSON_TYPE_MAXKEY;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   if (key_length < 0) {
      key_length = (int) strlen (key);
   }

   return _bson_append (
      bson, 3, (1 + key_length + 1), 1, &type, key_length, key, 1, &gZero);
}